

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O3

void render(void)

{
  double gpuDt;
  double cpuDt;
  double local_20;
  double local_18;
  
  djgc_start(g_gl.clocks[0]);
  renderScene();
  djgc_stop(g_gl.clocks[0]);
  djgc_ticks(g_gl.clocks[0],&local_18,&local_20);
  renderGui(local_18,local_20);
  renderBack();
  g_app.frame = g_app.frame + 1;
  return;
}

Assistant:

void render()
{
    double cpuDt, gpuDt;

    djgc_start(g_gl.clocks[CLOCK_SPF]);
    renderScene();
    djgc_stop(g_gl.clocks[CLOCK_SPF]);
    djgc_ticks(g_gl.clocks[CLOCK_SPF], &cpuDt, &gpuDt);
    renderGui(cpuDt, gpuDt);
    renderBack();
    ++g_app.frame;
}